

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void FFT::Backward(UnityComplexNumber *data,int numsamples,bool highprecision)

{
  int local_20;
  int n;
  float scale;
  bool highprecision_local;
  int numsamples_local;
  UnityComplexNumber *data_local;
  
  if (highprecision) {
    FFTProcess<double>(data,numsamples,false);
  }
  else {
    FFTProcess<float>(data,numsamples,false);
  }
  for (local_20 = 0; local_20 < numsamples; local_20 = local_20 + 1) {
    data[local_20].re = (1.0 / (float)numsamples) * data[local_20].re;
    data[local_20].im = (1.0 / (float)numsamples) * data[local_20].im;
  }
  return;
}

Assistant:

void FFT::Backward(UnityComplexNumber* data, int numsamples, bool highprecision)
{
    if (highprecision)
        FFTProcess<double>(data, numsamples, false);
    else
        FFTProcess<float>(data, numsamples, false);

    const float scale = 1.0f / (float)numsamples;
    for (int n = 0; n < numsamples; n++)
    {
        data[n].re *= scale;
        data[n].im *= scale;
    }
}